

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifSat.c
# Opt level: O2

void * If_ManSatBuildXYZ(int nLutSize)

{
  uint uVar1;
  int iVar2;
  sat_solver *s;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  lit local_88 [2];
  sat_solver *local_80;
  int local_78;
  int local_74;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  bVar3 = (byte)nLutSize;
  uVar9 = 1 << (bVar3 * '\x03' - 2 & 0x1f);
  uVar8 = 3 << (bVar3 & 0x1f);
  local_60 = (ulong)(uint)(2 << (bVar3 & 0x1f));
  s = sat_solver_new();
  sat_solver_setnvars(s,uVar9 + uVar8);
  local_74 = nLutSize * 2;
  uVar5 = 0;
  local_48 = (ulong)uVar9;
  if ((int)uVar9 < 1) {
    local_48 = uVar5;
  }
  uVar9 = uVar8 * 2;
  local_80 = s;
  local_78 = 1 << (bVar3 & 0x1f);
  local_58 = (ulong)uVar8;
  local_50 = (ulong)(uint)nLutSize;
  while( true ) {
    uVar8 = (uint)uVar5;
    if ((uint)local_48 == uVar8) {
      return s;
    }
    uVar4 = (int)(uVar8 >> ((byte)local_50 & 0x1f)) % local_78 + local_78;
    uVar1 = uVar8 >> ((byte)local_74 & 0x1f);
    iVar2 = (int)local_60;
    uVar10 = iVar2 + uVar1 * 4;
    uVar6 = iVar2 + uVar1 * 4 + 2;
    local_68 = (ulong)uVar6;
    uVar1 = iVar2 + uVar1 * 4 + 3;
    local_70 = (ulong)uVar1;
    if ((int)(uVar6 | uVar1 | (int)local_58 + uVar8 | uVar10 | uVar4) < 0) {
      __assert_fail("iVarC0 >= 0 && iVarC1 >= 0 && iVarD0 >= 0 && iVarD1 >= 0 && iVarD2 >= 0 && iVarD3 >= 0 && iVarZ >= 0"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                    ,0x1f5,
                    "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
    }
    local_98 = uVar10 * 2 + 1;
    uVar8 = ((int)uVar8 % local_78) * 2;
    uVar4 = uVar4 * 2;
    local_94 = uVar8;
    local_90 = uVar4;
    local_8c = uVar9;
    local_38 = uVar5;
    iVar2 = sat_solver_addclause(s,(lit *)&local_98,local_88);
    if (iVar2 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                    ,0x1fc,
                    "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
    }
    uVar10 = uVar10 * 2;
    local_98 = uVar10 | 3;
    uVar1 = uVar8 | 1;
    local_94 = uVar1;
    local_90 = uVar4;
    local_8c = uVar9;
    iVar2 = sat_solver_addclause(local_80,(lit *)&local_98,local_88);
    if (iVar2 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                    ,0x203,
                    "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
    }
    local_98 = (int)local_68 * 2 + 1;
    uVar6 = uVar4 | 1;
    local_94 = uVar8;
    local_90 = uVar6;
    local_8c = uVar9;
    iVar2 = sat_solver_addclause(local_80,(lit *)&local_98,local_88);
    if (iVar2 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                    ,0x20a,
                    "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
    }
    local_98 = (int)local_70 * 2 + 1;
    local_94 = uVar1;
    local_90 = uVar6;
    local_8c = uVar9;
    iVar2 = sat_solver_addclause(local_80,(lit *)&local_98,local_88);
    if (iVar2 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                    ,0x211,
                    "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
    }
    iVar7 = uVar9 + 1;
    local_98 = uVar10;
    local_94 = uVar8;
    local_90 = uVar4;
    local_8c = iVar7;
    local_40 = (ulong)uVar9;
    iVar2 = sat_solver_addclause(local_80,(lit *)&local_98,local_88);
    s = local_80;
    if (iVar2 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                    ,0x219,
                    "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
    }
    local_98 = uVar10 | 2;
    local_94 = uVar1;
    local_90 = uVar4;
    local_8c = iVar7;
    iVar2 = sat_solver_addclause(local_80,(lit *)&local_98,local_88);
    if (iVar2 == 0) break;
    local_98 = (int)local_68 * 2;
    local_94 = uVar8;
    local_90 = uVar6;
    local_8c = iVar7;
    iVar2 = sat_solver_addclause(s,(lit *)&local_98,local_88);
    if (iVar2 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                    ,0x227,
                    "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
    }
    local_98 = (int)local_70 * 2;
    local_94 = uVar1;
    local_90 = uVar6;
    local_8c = iVar7;
    iVar2 = sat_solver_addclause(s,(lit *)&local_98,local_88);
    if (iVar2 == 0) {
      __assert_fail("Cid",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                    ,0x22e,
                    "int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
    }
    uVar5 = (ulong)((int)local_38 + 1);
    uVar9 = (int)local_40 + 2;
  }
  __assert_fail("Cid",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/sat/bsat/satSolver.h"
                ,0x220,"int sat_solver_add_mux41(sat_solver *, int, int, int, int, int, int, int)");
}

Assistant:

void * If_ManSatBuildXYZ( int nLutSize )
{
    int nMintsL = (1 << nLutSize);
    int nMintsF = (1 << (3 * nLutSize - 2));
    int nVars   = 3 * nMintsL + nMintsF;
    int iVarP0  = 0;           // LUT0 parameters (total nMintsL)
    int iVarP1  = nMintsL;     // LUT1 parameters (total nMintsL)
    int iVarP2  = 2 * nMintsL; // LUT2 parameters (total nMintsL)
    int m,iVarM = 3 * nMintsL; // MUX vars        (total nMintsF)
    sat_solver * p = sat_solver_new();
    sat_solver_setnvars( p, nVars );
    for ( m = 0; m < nMintsF; m++ )
        sat_solver_add_mux41( p, 
            iVarM  + m,
            iVarP0 + m % nMintsL, 
            iVarP1 + (m >> nLutSize) % nMintsL, 
            iVarP2 + 4 * (m >> (2 * nLutSize)) + 0, 
            iVarP2 + 4 * (m >> (2 * nLutSize)) + 1, 
            iVarP2 + 4 * (m >> (2 * nLutSize)) + 2, 
            iVarP2 + 4 * (m >> (2 * nLutSize)) + 3 );
    return p;
}